

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O2

bool clip_model_quantize(char *fname_inp,char *fname_out,int itype)

{
  gguf_context *pgVar1;
  ggml_context *pgVar2;
  pointer pfVar3;
  pointer pbVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  clip_ctx *ctx;
  undefined8 uVar8;
  undefined8 uVar9;
  size_type __n;
  ulong uVar10;
  char *__s;
  int *piVar11;
  long lVar12;
  long lVar13;
  vector<float,_std::allocator<float>_> *pvVar14;
  long lVar15;
  uint uVar16;
  size_t j;
  ulong uVar17;
  pointer __s_00;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  size_type sVar21;
  pointer puVar22;
  bool bVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  vector<unsigned_char,_std::allocator<unsigned_char>_> meta;
  long local_2e0;
  long local_2d8;
  vector<float,_std::allocator<float>_> conv_buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> work;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  k_names;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_250;
  ofstream fout;
  
  ctx = clip_init(fname_inp,(clip_context_params)0x400000000);
  pgVar1 = (ctx->ctx_gguf)._M_t.super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
           super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
           super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl;
  pgVar2 = (ctx->ctx_data)._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
           super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
           super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl;
  uVar8 = gguf_init_empty();
  gguf_set_kv(uVar8,pgVar1);
  gguf_set_val_u32(uVar8,"general.quantization_version",2);
  gguf_set_val_u32(uVar8,"general.file_type",itype);
  std::ofstream::ofstream(&fout,fname_out,_S_bin);
  uVar5 = gguf_get_n_tensors(pgVar1);
  uVar17 = 0;
  uVar19 = 0;
  if (0 < (int)uVar5) {
    uVar19 = (ulong)uVar5;
  }
  for (; uVar19 != uVar17; uVar17 = uVar17 + 1) {
    uVar9 = gguf_get_tensor_name(pgVar1,uVar17);
    uVar9 = ggml_get_tensor(pgVar2,uVar9);
    gguf_add_tensor(uVar8,uVar9);
  }
  __n = gguf_get_meta_size(uVar8);
  sVar21 = __n;
  while (bVar23 = sVar21 != 0, sVar21 = sVar21 - 1, bVar23) {
    std::ostream::put((char)&fout);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&meta,".*weight",(allocator<char> *)&local_250);
  __l._M_len = 1;
  __l._M_array = (iterator)&meta;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&k_names,__l,(allocator_type *)&work);
  std::__cxx11::string::~string((string *)&meta);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&work,0x200,(allocator_type *)&meta);
  std::vector<float,_std::allocator<float>_>::vector(&conv_buf,0x200,(allocator_type *)&meta);
  local_2d8 = 0;
  local_2e0 = 0;
  uVar17 = 0;
  do {
    uVar10 = uVar17;
    if (uVar10 == uVar19) {
      std::ostream::seekp((long)&fout,_S_beg);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&meta,__n,(allocator_type *)&local_250);
      gguf_get_meta_data(uVar8,meta.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
      std::ostream::write((char *)&fout,
                          (long)meta.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
      std::ofstream::close();
      clip_free(ctx);
      gguf_free(uVar8);
      if (((int)g_logger_state.verbosity_thold < 3) &&
         (auVar26._0_8_ = (double)CONCAT44(0x43300000,(int)local_2d8),
         auVar26._8_4_ = (int)((ulong)local_2d8 >> 0x20), auVar26._12_4_ = 0x45300000,
         clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: original  size = %8.2f MB\n",
                           ((auVar26._8_8_ - 1.9342813113834067e+25) +
                           (auVar26._0_8_ - 4503599627370496.0)) * 0.0009765625 * 0.0009765625,
                           "clip_model_quantize"), (int)g_logger_state.verbosity_thold < 3)) {
        auVar27._0_8_ = (double)CONCAT44(0x43300000,(int)local_2e0);
        auVar27._8_4_ = (int)((ulong)local_2e0 >> 0x20);
        auVar27._12_4_ = 0x45300000;
        clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: quantized size = %8.2f MB\n",
                          ((auVar27._8_8_ - 1.9342813113834067e+25) +
                          (auVar27._0_8_ - 4503599627370496.0)) * 0.0009765625 * 0.0009765625,
                          "clip_model_quantize");
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&meta.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      break;
    }
    __s = (char *)gguf_get_tensor_name(pgVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&meta,__s,(allocator<char> *)&local_250);
    piVar11 = (int *)ggml_get_tensor(pgVar2,meta.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
    pbVar4 = k_names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    __s_00 = k_names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (__s_00 == pbVar4) {
        uVar16 = 0;
        goto LAB_001400e1;
      }
      std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
      basic_regex<std::char_traits<char>,std::allocator<char>>
                ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&local_250,__s_00,0x10);
      bVar23 = std::
               regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&meta
                          ,&local_250,0);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_250);
      __s_00 = __s_00 + 1;
    } while (!bVar23);
    uVar16 = 1;
LAB_001400e1:
    iVar6 = ggml_n_dims(piVar11);
    uVar20 = 0;
    if (iVar6 == 2) {
      lVar13 = *(long *)(piVar11 + 4);
      lVar12 = ggml_blck_size(itype);
      uVar20 = (uint)(lVar12 < lVar13);
    }
    if ((uVar20 & uVar16) == 0) {
      iVar6 = *piVar11;
      puVar22 = *(pointer *)(piVar11 + 0x3e);
      uVar17 = ggml_nbytes(piVar11);
LAB_00140272:
      lVar13 = ggml_nbytes(piVar11);
      gguf_set_tensor_type
                (uVar8,meta.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,iVar6);
      uVar9 = gguf_find_tensor(uVar8,meta.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
      uVar18 = gguf_get_tensor_size(uVar8,uVar9);
      if (uVar18 != uVar17) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llava/clip.cpp"
                   ,0xc37,"GGML_ASSERT(%s) failed",
                   "gguf_get_tensor_size(ctx_out, gguf_find_tensor(ctx_out, name.c_str())) == new_size"
                  );
      }
      gguf_set_tensor_data
                (uVar8,meta.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,puVar22);
      std::ostream::write((char *)&fout,(long)puVar22);
      lVar12 = gguf_get_alignment(uVar8);
      lVar15 = gguf_get_alignment(uVar8);
      local_2d8 = local_2d8 + lVar13;
      local_2e0 = local_2e0 + uVar17;
      for (uVar18 = -lVar15 & (uVar17 + lVar12) - 1;
          puVar22 = meta.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start, uVar17 != uVar18; uVar18 = uVar18 - 1) {
        std::ostream::put((char)&fout);
      }
      bVar23 = true;
      if ((int)g_logger_state.verbosity_thold < 3) {
        uVar7 = ggml_n_dims(piVar11);
        auVar25._8_4_ = (int)((ulong)lVar13 >> 0x20);
        auVar25._0_8_ = lVar13;
        auVar25._12_4_ = 0x45300000;
        auVar28._8_4_ = (int)(uVar17 >> 0x20);
        auVar28._0_8_ = uVar17;
        auVar28._12_4_ = 0x45300000;
        clip_log_internal(GGML_LOG_LEVEL_INFO,
                          "%s: n_dims = %d | quantize=%d | size = %f MB -> %f MB\n",
                          ((auVar25._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0)) *
                          0.0009765625 * 0.0009765625,
                          ((auVar28._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)uVar17) - 4503599627370496.0)) *
                          0.0009765625 * 0.0009765625,puVar22,(ulong)uVar7,(ulong)(uVar20 & uVar16))
        ;
      }
    }
    else {
      iVar6 = itype;
      if (9 < itype) {
        lVar13 = std::__cxx11::string::find((char *)&meta,0x1ed931);
        iVar6 = 8;
        if (lVar13 == -1) {
          iVar6 = itype;
        }
      }
      uVar17 = ggml_nelements(piVar11);
      if (*piVar11 == 0) {
        pvVar14 = (vector<float,_std::allocator<float>_> *)(piVar11 + 0x3e);
LAB_00140215:
        pfVar3 = (pvVar14->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)((long)work.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)work.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start) < uVar17 << 2) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&work,uVar17 << 2);
        }
        puVar22 = work.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar17 = ggml_quantize_chunk(iVar6,pfVar3,
                                     work.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,0,
                                     uVar17 / *(ulong *)(piVar11 + 4),*(ulong *)(piVar11 + 4),0);
        goto LAB_00140272;
      }
      if (*piVar11 == 1) {
        if ((ulong)((long)conv_buf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)conv_buf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) < uVar17) {
          std::vector<float,_std::allocator<float>_>::resize(&conv_buf,uVar17);
        }
        for (uVar18 = 0; uVar17 != uVar18; uVar18 = uVar18 + 1) {
          fVar24 = (float)ggml_fp16_to_fp32(*(undefined2 *)(*(long *)(piVar11 + 0x3e) + uVar18 * 2))
          ;
          conv_buf.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[uVar18] = fVar24;
        }
        pvVar14 = &conv_buf;
        goto LAB_00140215;
      }
      if ((int)g_logger_state.verbosity_thold < 5) {
        clip_log_internal(GGML_LOG_LEVEL_ERROR,"%s: Please use an input file in f32 or f16\n",
                          "clip_model_quantize");
      }
      gguf_free(uVar8);
      bVar23 = false;
    }
    std::__cxx11::string::~string((string *)&meta);
    uVar17 = uVar10 + 1;
  } while (bVar23);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&conv_buf.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&work.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&k_names);
  std::ofstream::~ofstream(&fout);
  return (long)(int)uVar5 <= (long)uVar10;
}

Assistant:

bool clip_model_quantize(const char * fname_inp, const char * fname_out, const int itype) {
    assert(itype < GGML_TYPE_COUNT);
    ggml_type type = static_cast<ggml_type>(itype);

    auto * ctx_clip = clip_init(fname_inp, clip_context_params{
        /* use_gpu */   false,
        /* verbosity */ GGML_LOG_LEVEL_ERROR,
    });

    const auto & ctx_src = ctx_clip->ctx_gguf.get();
    const auto & ctx_data = ctx_clip->ctx_data.get();

    auto * ctx_out = gguf_init_empty();
    gguf_set_kv(ctx_out, ctx_src);
    gguf_set_val_u32(ctx_out, "general.quantization_version", GGML_QNT_VERSION);
    gguf_set_val_u32(ctx_out, "general.file_type", itype);

    auto fout = std::ofstream(fname_out, std::ios::binary);

    const int n_tensors = gguf_get_n_tensors(ctx_src);

    for (int i = 0; i < n_tensors; ++i) {
        const char * name = gguf_get_tensor_name(ctx_src, i);
        struct ggml_tensor * cur = ggml_get_tensor(ctx_data, name);
        gguf_add_tensor(ctx_out, cur);
    }

    const size_t meta_size = gguf_get_meta_size(ctx_out);
    for (size_t i = 0; i < meta_size; ++i) {
        fout.put(0);
    }

    // regexes of tensor names to be quantized
    const std::vector<std::string> k_names = {
        ".*weight",
    };

    std::vector<uint8_t> work(512);
    std::vector<float> conv_buf(512);
    size_t total_size_org = 0;
    size_t total_size_new = 0;

    for (int i = 0; i < n_tensors; ++i) {
        const std::string name = gguf_get_tensor_name(ctx_src, i);
        struct ggml_tensor * cur = ggml_get_tensor(ctx_data, name.c_str());

        enum ggml_type new_type;
        void * new_data;
        size_t new_size;

        bool quantize = false;
        for (const auto & s : k_names) {
            if (std::regex_match(name, std::regex(s))) {
                quantize = true;
                break;
            }
        }

        // quantize only 2D tensors and bigger than block size
        quantize &= (ggml_n_dims(cur) == 2) && cur->ne[0] > ggml_blck_size(type);

        if (quantize) {
            new_type = type;
            if (new_type >= GGML_TYPE_Q2_K && name.find("embd") != std::string::npos) {
                new_type = GGML_TYPE_Q8_0; // ggml_get_rows needs non K type
                // LOG_ERR("%s: quantizing %s to %s\n", __func__, name.c_str(), ggml_type_name(new_type));
            }
            const size_t n_elms = ggml_nelements(cur);
            float * f32_data;

            switch (cur->type) {
            case GGML_TYPE_F32:
                f32_data = (float *)cur->data;
                break;
            case GGML_TYPE_F16:
                if (conv_buf.size() < n_elms) {
                    conv_buf.resize(n_elms);
                }
                for (size_t j = 0; j < n_elms; ++j) {
                    conv_buf[j] = ggml_fp16_to_fp32(((ggml_fp16_t *)cur->data)[j]);
                }
                f32_data = (float *)conv_buf.data();
                break;
            default:
                LOG_ERR("%s: Please use an input file in f32 or f16\n", __func__);
                gguf_free(ctx_out);
                return false;
            }

            if (work.size() < n_elms * 4) {
                work.resize(n_elms * 4);
            }
            new_data = work.data();

            new_size = ggml_quantize_chunk(new_type, f32_data, new_data, 0, n_elms/cur->ne[0], cur->ne[0], nullptr);
        } else {
            new_type = cur->type;
            new_data = cur->data;
            new_size = ggml_nbytes(cur);
        }
        const size_t orig_size = ggml_nbytes(cur);
        total_size_org += orig_size;
        total_size_new += new_size;
        gguf_set_tensor_type(ctx_out, name.c_str(), new_type);
        GGML_ASSERT(gguf_get_tensor_size(ctx_out, gguf_find_tensor(ctx_out, name.c_str())) == new_size);
        gguf_set_tensor_data(ctx_out, name.c_str(), new_data);
        fout.write((const char *)new_data, new_size);
        size_t pad = GGML_PAD(new_size, gguf_get_alignment(ctx_out)) - new_size;
        for (size_t j = 0; j < pad; ++j) {
            fout.put(0);
        }

        LOG_INF("%s: n_dims = %d | quantize=%d | size = %f MB -> %f MB\n", name.c_str(), ggml_n_dims(cur), quantize,
               orig_size / 1024.0 / 1024.0, new_size / 1024.0 / 1024.0);
    }

    // go back to beginning of file and write the updated metadata
    fout.seekp(0, std::ios::beg);
    std::vector<uint8_t> meta(meta_size);
    gguf_get_meta_data(ctx_out, meta.data());
    fout.write((const char *)meta.data(), meta_size);

    fout.close();

    clip_free(ctx_clip);
    gguf_free(ctx_out);

    {
        LOG_INF("%s: original  size = %8.2f MB\n", __func__, total_size_org / 1024.0 / 1024.0);
        LOG_INF("%s: quantized size = %8.2f MB\n", __func__, total_size_new / 1024.0 / 1024.0);
    }

    return true;
}